

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t * Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int nFrames)

{
  ushort *puVar1;
  Wlc_Obj_t *pWVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  Wlc_Obj_t *pWVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Wlc_Obj_t *pWVar11;
  uint uVar12;
  ulong uVar13;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar14;
  long lVar15;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  uVar12 = p->iObj;
  if (1 < (int)uVar12) {
    lVar8 = 1;
    lVar9 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar8) goto LAB_00362163;
      puVar1 = (ushort *)(&p->pObjs->field_0x0 + lVar9);
      *puVar1 = *puVar1 & 0xfeff;
      lVar8 = lVar8 + 1;
      uVar12 = p->iObj;
      lVar9 = lVar9 + 0x18;
    } while (lVar8 < (int)uVar12);
  }
  uVar13 = (ulong)(uint)vMemObjsClean->nSize;
  if (0 < vMemObjsClean->nSize) {
    lVar8 = 0;
    do {
      lVar9 = (long)vMemObjsClean->pArray[lVar8];
      if ((lVar9 < 1) || (p->nObjsAlloc <= vMemObjsClean->pArray[lVar8])) goto LAB_00362163;
      pWVar6 = p->pObjs;
      if (((undefined1  [24])((undefined1  [24])pWVar6[lVar9] & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x36) && (0 < (int)uVar13)) {
        lVar15 = 0;
        do {
          lVar10 = (long)vMemObjsClean->pArray[lVar15];
          if ((lVar10 < 1) || (p->nObjsAlloc <= vMemObjsClean->pArray[lVar15])) goto LAB_00362163;
          uVar3 = *(ushort *)(p->pObjs + lVar10);
          if ((uVar3 & 0x3d) == 1) {
            pWVar2 = p->pObjs + lVar10;
            *(ushort *)pWVar2 = uVar3 | 0x100;
            uVar13 = (ulong)(uint)vMemObjsClean->nSize;
            if (0 < vMemObjsClean->nSize) {
              lVar10 = 0;
              do {
                iVar4 = vMemObjsClean->pArray[lVar10];
                if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00362163;
                pWVar11 = p->pObjs + iVar4;
                if (pWVar11 != pWVar2) {
                  uVar12 = *(uint *)pWVar11;
                  if ((uVar12 >> 8 & 1) != 0) {
                    __assert_fail("pObj->Mark2 == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                                  ,0x4d9,
                                  "Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)"
                                 );
                  }
                  uVar5 = pWVar11->nFanins;
                  if (0 < (long)(int)uVar5) {
                    uVar13 = 0;
                    do {
                      if ((2 < uVar5) ||
                         (paVar14 = &pWVar11->field_10, (uVar12 & 0x2f | 0x10) == 0x16)) {
                        paVar14 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                  (pWVar11->field_10).pFanins[0];
                      }
                      iVar4 = paVar14->Fanins[uVar13];
                      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00362163;
                      uVar12 = uVar12 | *(ushort *)(p->pObjs + iVar4) & 0x100;
                      *(short *)pWVar11 = (short)uVar12;
                      uVar13 = uVar13 + 1;
                    } while (uVar13 < (ulong)(long)(int)uVar5);
                    uVar13 = (ulong)(uint)vMemObjsClean->nSize;
                  }
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < (int)uVar13);
            }
            if ((pWVar6[lVar9].field_0x1 & 1) != 0) {
              pWVar11 = p->pObjs;
              Vec_IntPush(p_00,(int)((ulong)((long)pWVar6 + (lVar9 * 0x18 - (long)pWVar11)) >> 3) *
                               -0x55555555);
              Vec_IntPush(p_00,(int)((ulong)((long)pWVar2 - (long)pWVar11) >> 3) * -0x55555555);
              Vec_IntPush(p_00,-1);
              uVar13 = (ulong)(uint)vMemObjsClean->nSize;
            }
            if (0 < (int)uVar13) {
              lVar10 = 0;
              do {
                iVar4 = vMemObjsClean->pArray[lVar10];
                if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00362163;
                *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) & 0xfeff;
                lVar10 = lVar10 + 1;
                uVar13 = (ulong)vMemObjsClean->nSize;
              } while (lVar10 < (long)uVar13);
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)uVar13);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar13);
    uVar12 = p->iObj;
  }
  if (1 < (int)uVar12) {
    uVar13 = 1;
    if (1 < p->nObjsAlloc) {
      uVar13 = (ulong)(uint)p->nObjsAlloc;
    }
    lVar8 = 0x18;
    do {
      if (uVar13 * 0x18 == lVar8) {
LAB_00362163:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (((&p->pObjs->field_0x1)[lVar8] & 1) != 0) {
        __assert_fail("pObj->Mark2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x4e4,"Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
      }
      lVar8 = lVar8 + 0x18;
    } while ((ulong)uVar12 * 0x18 != lVar8);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkFindReachablePiFo( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int nFrames )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObjR, * pObjI, * pObj; 
    int i, j, k, f, fFanin;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark2 = 0;
    // go through read ports
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjR, i ) if ( Wlc_ObjIsRead(pObjR) )
    {
        // go through memory CIs
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjI, j ) if ( Wlc_ObjIsCi(pObjI) )
        {
            // propagate bit from CI to READ
            pObjI->Mark2 = 1;
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
            {
                if ( pObj == pObjI )
                    continue;
                assert( pObj->Mark2 == 0 );
                Wlc_ObjForEachFanin( pObj, fFanin, f )
                    pObj->Mark2 |= Wlc_NtkObj(p, fFanin)->Mark2;
            }
            if ( pObjR->Mark2 )
                Vec_IntPushThree( vRes, Wlc_ObjId(p, pObjR), Wlc_ObjId(p, pObjI), -1 );
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
                pObj->Mark2 = 0;
        }
    }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark2 == 0 );
    return vRes;
}